

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall SocketReceiveMultiplexer::Implementation::Run(Implementation *this)

{
  pointer ppVar1;
  uint __i;
  int iVar2;
  long lVar3;
  char *data;
  size_t sVar4;
  int *piVar5;
  runtime_error *this_00;
  bool bVar6;
  fd_set *pfVar7;
  pointer ppVar8;
  fd_set *pfVar9;
  timeval *__timeout;
  int iVar10;
  pointer pAVar11;
  pointer ppVar12;
  byte bVar13;
  double dVar14;
  double dVar15;
  char c;
  double local_180;
  vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  timerQueue_;
  timeval timeout;
  IpEndpointName remoteEndpoint;
  fd_set tempfds;
  fd_set masterfds;
  
  bVar13 = 0;
  this->break_ = false;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    masterfds.fds_bits[lVar3] = 0;
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    tempfds.fds_bits[lVar3] = 0;
  }
  iVar10 = this->breakPipe_[0];
  masterfds.fds_bits[iVar10 / 0x40] =
       masterfds.fds_bits[iVar10 / 0x40] | 1L << ((byte)iVar10 & 0x3f);
  ppVar1 = (this->socketListeners_).
           super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (this->socketListeners_).
                super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1; ppVar8 = ppVar8 + 1) {
    iVar2 = ppVar8->second->impl_->socket_;
    if (iVar10 <= iVar2) {
      iVar10 = iVar2;
    }
    masterfds.fds_bits[iVar2 / 0x40] = masterfds.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f)
    ;
  }
  local_180 = GetCurrentTimeMs(this);
  timerQueue_.
  super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  timerQueue_.
  super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  timerQueue_.
  super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pAVar11 = (this->timerListeners_).
                 super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pAVar11 !=
      (this->timerListeners_).
      super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
      super__Vector_impl_data._M_finish; pAVar11 = pAVar11 + 1) {
    remoteEndpoint.address = (unsigned_long)((double)pAVar11->initialDelayMs + local_180);
    remoteEndpoint.port = pAVar11->initialDelayMs;
    remoteEndpoint._12_4_ = pAVar11->periodMs;
    std::
    vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>
    ::emplace_back<std::pair<double,AttachedTimerListener>>
              ((vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>
                *)&timerQueue_,(pair<double,_AttachedTimerListener> *)&remoteEndpoint);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>>
            ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
              )timerQueue_.
               super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
              )timerQueue_.
               super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_std::pair<double,_AttachedTimerListener>_&,_const_std::pair<double,_AttachedTimerListener>_&)>
              )0x10424a);
  data = (char *)operator_new__(0x1002);
  remoteEndpoint.address = 0xffffffff;
  remoteEndpoint.port = -1;
  while (this->break_ == false) {
    pfVar7 = &masterfds;
    pfVar9 = (fd_set *)&tempfds;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pfVar9->fds_bits[0] = pfVar7->fds_bits[0];
      pfVar7 = (fd_set *)((long)pfVar7 + ((ulong)bVar13 * -2 + 1) * 8);
      pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    if (timerQueue_.
        super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        timerQueue_.
        super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __timeout = (timeval *)0x0;
    }
    else {
      local_180 = (timerQueue_.
                   super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first;
      dVar14 = GetCurrentTimeMs(this);
      dVar15 = 0.0;
      if (0.0 <= local_180 - dVar14) {
        dVar15 = local_180 - dVar14;
      }
      timeout.tv_sec = (__time_t)(dVar15 * 0.001);
      timeout.tv_usec = (__suseconds_t)((dVar15 - (double)(timeout.tv_sec * 1000)) * 1000.0);
      __timeout = &timeout;
    }
    iVar2 = select(iVar10 + 1,(fd_set *)&tempfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)__timeout);
    if (iVar2 < 0) {
      if (this->break_ != false) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"select failed\n");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar2 = this->breakPipe_[0];
      if (((ulong)tempfds.fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0) {
        read(iVar2,&c,1);
      }
      if (this->break_ != false) break;
      for (ppVar8 = (this->socketListeners_).
                    super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar8 != (this->socketListeners_).
                    super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
        iVar2 = ppVar8->second->impl_->socket_;
        if (((ulong)tempfds.fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0) {
          sVar4 = UdpSocket::ReceiveFrom(ppVar8->second,&remoteEndpoint,data,0x1002);
          if (sVar4 != 0) {
            (*ppVar8->first->_vptr_PacketListener[2])
                      (ppVar8->first,data,sVar4 & 0xffffffff,&remoteEndpoint);
            if (this->break_ != false) break;
          }
        }
      }
      local_180 = GetCurrentTimeMs(this);
      bVar6 = false;
      for (ppVar12 = timerQueue_.
                     super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          (ppVar12 !=
           timerQueue_.
           super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish && (ppVar12->first <= local_180));
          ppVar12 = ppVar12 + 1) {
        (**(code **)(*(long *)(ppVar12->second).listener + 0x10))();
        if (this->break_ != false) break;
        ppVar12->first = (double)(ppVar12->second).periodMs + ppVar12->first;
        bVar6 = true;
      }
      if (bVar6) {
        std::
        __sort<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>>
                  ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                    )timerQueue_.
                     super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                    )timerQueue_.
                     super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(const_std::pair<double,_AttachedTimerListener>_&,_const_std::pair<double,_AttachedTimerListener>_&)>
                    )0x10424a);
      }
    }
  }
  operator_delete__(data);
  std::
  _Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  ::~_Vector_base(&timerQueue_.
                   super__Vector_base<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
                 );
  return;
}

Assistant:

void Run()
	{
		break_ = false;
        char *data = 0;
        
        try{
            
            // configure the master fd_set for select()

            fd_set masterfds, tempfds;
            FD_ZERO( &masterfds );
            FD_ZERO( &tempfds );
            
            // in addition to listening to the inbound sockets we
            // also listen to the asynchronous break pipe, so that AsynchronousBreak()
            // can break us out of select() from another thread.
            FD_SET( breakPipe_[0], &masterfds );
            int fdmax = breakPipe_[0];		

            for( std::vector< std::pair< PacketListener*, UdpSocket* > >::iterator i = socketListeners_.begin();
                    i != socketListeners_.end(); ++i ){

                if( fdmax < i->second->impl_->Socket() )
                    fdmax = i->second->impl_->Socket();
                FD_SET( i->second->impl_->Socket(), &masterfds );
            }


            // configure the timer queue
            double currentTimeMs = GetCurrentTimeMs();

            // expiry time ms, listener
            std::vector< std::pair< double, AttachedTimerListener > > timerQueue_;
            for( std::vector< AttachedTimerListener >::iterator i = timerListeners_.begin();
                    i != timerListeners_.end(); ++i )
                timerQueue_.push_back( std::make_pair( currentTimeMs + i->initialDelayMs, *i ) );
            std::sort( timerQueue_.begin(), timerQueue_.end(), CompareScheduledTimerCalls );

            const int MAX_BUFFER_SIZE = 4098;
            data = new char[ MAX_BUFFER_SIZE ];
            IpEndpointName remoteEndpoint;

            struct timeval timeout;

            while( !break_ ){
                tempfds = masterfds;

                struct timeval *timeoutPtr = 0;
                if( !timerQueue_.empty() ){
                    double timeoutMs = timerQueue_.front().first - GetCurrentTimeMs();
                    if( timeoutMs < 0 )
                        timeoutMs = 0;
                
                    long timoutSecondsPart = (long)(timeoutMs * .001);
                    timeout.tv_sec = (time_t)timoutSecondsPart;
                    // 1000000 microseconds in a second
                    timeout.tv_usec = (suseconds_t)((timeoutMs - (timoutSecondsPart * 1000)) * 1000);
                    timeoutPtr = &timeout;
                }

                if( select( fdmax + 1, &tempfds, 0, 0, timeoutPtr ) < 0 ){
                    if( break_ ){
                        break;
                    }else if( errno == EINTR ){
                        // on returning an error, select() doesn't clear tempfds.
                        // so tempfds would remain all set, which would cause read( breakPipe_[0]...
                        // below to block indefinitely. therefore if select returns EINTR we restart
                        // the while() loop instead of continuing on to below.
                        continue;
                    }else{
                        throw std::runtime_error("select failed\n");
                    }
                }

                if( FD_ISSET( breakPipe_[0], &tempfds ) ){
                    // clear pending data from the asynchronous break pipe
                    char c;
                    read( breakPipe_[0], &c, 1 );
                }
                
                if( break_ )
                    break;

                for( std::vector< std::pair< PacketListener*, UdpSocket* > >::iterator i = socketListeners_.begin();
                        i != socketListeners_.end(); ++i ){

                    if( FD_ISSET( i->second->impl_->Socket(), &tempfds ) ){

                        std::size_t size = i->second->ReceiveFrom( remoteEndpoint, data, MAX_BUFFER_SIZE );
                        if( size > 0 ){
                            i->first->ProcessPacket( data, (int)size, remoteEndpoint );
                            if( break_ )
                                break;
                        }
                    }
                }

                // execute any expired timers
                currentTimeMs = GetCurrentTimeMs();
                bool resort = false;
                for( std::vector< std::pair< double, AttachedTimerListener > >::iterator i = timerQueue_.begin();
                        i != timerQueue_.end() && i->first <= currentTimeMs; ++i ){

                    i->second.listener->TimerExpired();
                    if( break_ )
                        break;

                    i->first += i->second.periodMs;
                    resort = true;
                }
                if( resort )
                    std::sort( timerQueue_.begin(), timerQueue_.end(), CompareScheduledTimerCalls );
            }

            delete [] data;
        }catch(...){
            if( data )
                delete [] data;
            throw;
        }
	}